

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSwitchArg.h
# Opt level: O0

bool __thiscall
TCLAP::MultiSwitchArg::processArg
          (MultiSwitchArg *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  int *i_local;
  MultiSwitchArg *this_local;
  
  if ((((this->super_SwitchArg).super_Arg._ignoreable & 1U) == 0) ||
     (bVar1 = Arg::ignoreRest(), !bVar1)) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(long)*i);
    uVar2 = (*(this->super_SwitchArg).super_Arg._vptr_Arg[6])(this,pvVar3);
    if ((uVar2 & 1) == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(long)*i);
      bVar1 = SwitchArg::combinedSwitchesMatch(&this->super_SwitchArg,pvVar3);
      if (bVar1) {
        (this->super_SwitchArg).super_Arg._alreadySet = true;
        this->_value = this->_value + 1;
        while( true ) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(long)*i);
          bVar1 = SwitchArg::combinedSwitchesMatch(&this->super_SwitchArg,pvVar3);
          if (!bVar1) break;
          this->_value = this->_value + 1;
        }
        Arg::_checkWithVisitor((Arg *)this);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      (this->super_SwitchArg).super_Arg._alreadySet = true;
      this->_value = this->_value + 1;
      Arg::_checkWithVisitor((Arg *)this);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool MultiSwitchArg::processArg(int *i, std::vector<std::string>& args)
{
	if ( _ignoreable && Arg::ignoreRest() )
		return false;

	if ( argMatches( args[*i] ))
	{
		// so the isSet() method will work
		_alreadySet = true;

		// Matched argument: increment value.
		++_value;

		_checkWithVisitor();

		return true;
	}
	else if ( combinedSwitchesMatch( args[*i] ) )
	{
		// so the isSet() method will work
		_alreadySet = true;

		// Matched argument: increment value.
		++_value;

		// Check for more in argument and increment value.
		while ( combinedSwitchesMatch( args[*i] ) ) 
			++_value;

		_checkWithVisitor();

		return false;
	}
	else
		return false;
}